

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void Catch::anon_unknown_26::writeSourceInfo(JsonObjectWriter *writer,SourceLineInfo *sourceInfo)

{
  JsonValueWriter *in_RDI;
  StringRef SVar1;
  JsonObjectWriter source_location_writer;
  JsonValueWriter *in_stack_fffffffffffffab8;
  JsonObjectWriter *this;
  JsonValueWriter *in_stack_fffffffffffffad0;
  size_t local_528;
  JsonObjectWriter local_520 [17];
  StringRef local_388;
  JsonObjectWriter local_378 [17];
  StringRef local_1d0;
  JsonObjectWriter local_1c0 [17];
  undefined1 local_28 [40];
  
  local_1d0 = operator____sr((char *)in_RDI,(size_t)in_stack_fffffffffffffab8);
  this = local_1c0;
  JsonObjectWriter::write(this,(int)in_RDI,local_1d0.m_start,local_1d0.m_size);
  JsonValueWriter::writeObject(in_stack_fffffffffffffab8);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a441d);
  local_388 = operator____sr((char *)in_RDI,(size_t)in_stack_fffffffffffffab8);
  JsonObjectWriter::write(local_378,(int)local_28,local_388.m_start,local_388.m_size);
  JsonValueWriter::write<char_const*>(in_stack_fffffffffffffad0,(char **)this);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a4489);
  SVar1 = operator____sr((char *)in_RDI,(size_t)in_stack_fffffffffffffab8);
  local_528 = SVar1.m_size;
  JsonObjectWriter::write(local_520,(int)local_28,SVar1.m_start,local_528);
  JsonValueWriter::write<unsigned_long>(in_RDI,(unsigned_long *)in_stack_fffffffffffffab8);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a44e4);
  JsonObjectWriter::~JsonObjectWriter((JsonObjectWriter *)in_RDI);
  return;
}

Assistant:

void writeSourceInfo( JsonObjectWriter& writer,
                              SourceLineInfo const& sourceInfo ) {
            auto source_location_writer =
                writer.write( "source-location"_sr ).writeObject();
            source_location_writer.write( "filename"_sr )
                .write( sourceInfo.file );
            source_location_writer.write( "line"_sr ).write( sourceInfo.line );
        }